

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O3

void __thiscall
cmLocalUnixMakefileGenerator3::WriteSpecialTargetsBottom
          (cmLocalUnixMakefileGenerator3 *this,ostream *makefileStream)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  char *tgtDir;
  char *pcVar3;
  allocator local_c9;
  string local_c8;
  string runRule;
  string cmakefileName;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  commands;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  no_depends;
  
  std::__ostream_insert<char,std::char_traits<char>>
            (makefileStream,"#======================================",0x27);
  std::__ostream_insert<char,std::char_traits<char>>
            (makefileStream,"=======================================\n",0x28);
  std::__ostream_insert<char,std::char_traits<char>>
            (makefileStream,"# Special targets to cleanup operation of make.\n",0x30);
  std::__ostream_insert<char,std::char_traits<char>>(makefileStream,"\n",1);
  cmakefileName._M_dataplus._M_p = (pointer)&cmakefileName.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&cmakefileName,"CMakeFiles/","");
  std::__cxx11::string::append((char *)&cmakefileName);
  runRule._M_dataplus._M_p = (pointer)&runRule.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&runRule,"$(CMAKE_COMMAND) -H$(CMAKE_SOURCE_DIR) -B$(CMAKE_BINARY_DIR)","");
  std::__cxx11::string::append((char *)&runRule);
  cmOutputConverter::ConvertToOutputFormat
            (&local_c8,
             &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter,
             &cmakefileName,SHELL);
  std::__cxx11::string::_M_append((char *)&runRule,(ulong)local_c8._M_dataplus._M_p);
  paVar1 = &local_c8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)&runRule);
  no_depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  no_depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  no_depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  commands.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  commands.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  commands.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&commands,&runRule);
  bVar2 = cmLocalGenerator::IsRootMakefile((cmLocalGenerator *)this);
  if (!bVar2) {
    tgtDir = cmLocalGenerator::GetBinaryDirectory((cmLocalGenerator *)this);
    pcVar3 = cmLocalGenerator::GetCurrentBinaryDirectory((cmLocalGenerator *)this);
    std::__cxx11::string::string((string *)&local_c8,pcVar3,&local_c9);
    CreateCDCommand(this,&commands,tgtDir,&local_c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != paVar1) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
  }
  local_c8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"cmake_check_build_system","")
  ;
  WriteMakeRule(this,makefileStream,
                "Special rule to run CMake to check the build system integrity.\nNo rule that depends on this can have commands that come from listfiles\nbecause they might be regenerated."
                ,&local_c8,&no_depends,&commands,true,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&commands);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&no_depends);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)runRule._M_dataplus._M_p != &runRule.field_2) {
    operator_delete(runRule._M_dataplus._M_p,runRule.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)cmakefileName._M_dataplus._M_p != &cmakefileName.field_2) {
    operator_delete(cmakefileName._M_dataplus._M_p,cmakefileName.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmLocalUnixMakefileGenerator3::WriteSpecialTargetsBottom(
  std::ostream& makefileStream)
{
  this->WriteDivider(makefileStream);
  makefileStream << "# Special targets to cleanup operation of make.\n"
                 << "\n";

  // Write special "cmake_check_build_system" target to run cmake with
  // the --check-build-system flag.
  {
    // Build command to run CMake to check if anything needs regenerating.
    std::string cmakefileName = cmake::GetCMakeFilesDirectoryPostSlash();
    cmakefileName += "Makefile.cmake";
    std::string runRule =
      "$(CMAKE_COMMAND) -H$(CMAKE_SOURCE_DIR) -B$(CMAKE_BINARY_DIR)";
    runRule += " --check-build-system ";
    runRule +=
      this->ConvertToOutputFormat(cmakefileName, cmOutputConverter::SHELL);
    runRule += " 0";

    std::vector<std::string> no_depends;
    std::vector<std::string> commands;
    commands.push_back(runRule);
    if (!this->IsRootMakefile()) {
      this->CreateCDCommand(commands, this->GetBinaryDirectory(),
                            this->GetCurrentBinaryDirectory());
    }
    this->WriteMakeRule(
      makefileStream, "Special rule to run CMake to check the build system "
                      "integrity.\n"
                      "No rule that depends on this can have "
                      "commands that come from listfiles\n"
                      "because they might be regenerated.",
      "cmake_check_build_system", no_depends, commands, true);
  }
}